

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall ASN1Test_MBString_Test::TestBody(ASN1Test_MBString_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  initializer_list<unsigned_char> __l_16;
  initializer_list<unsigned_char> __l_17;
  initializer_list<unsigned_char> __l_18;
  initializer_list<unsigned_char> __l_19;
  initializer_list<unsigned_char> __l_20;
  initializer_list<unsigned_char> __l_21;
  initializer_list<unsigned_char> __l_22;
  initializer_list<unsigned_char> __l_23;
  initializer_list<unsigned_char> __l_24;
  initializer_list<unsigned_char> __l_25;
  initializer_list<unsigned_char> __l_26;
  initializer_list<unsigned_char> __l_27;
  initializer_list<unsigned_char> __l_28;
  initializer_list<unsigned_char> __l_29;
  initializer_list<unsigned_char> __l_30;
  initializer_list<unsigned_char> __l_31;
  initializer_list<unsigned_char> __l_32;
  initializer_list<unsigned_char> __l_33;
  initializer_list<unsigned_char> __l_34;
  initializer_list<unsigned_char> __l_35;
  initializer_list<unsigned_char> __l_36;
  initializer_list<unsigned_char> __l_37;
  initializer_list<unsigned_char> __l_38;
  initializer_list<unsigned_char> __l_39;
  initializer_list<unsigned_char> __l_40;
  initializer_list<unsigned_char> __l_41;
  initializer_list<unsigned_char> __l_42;
  initializer_list<unsigned_char> __l_43;
  bool bVar1;
  int iVar2;
  int *piVar3;
  uchar *puVar4;
  size_type sVar5;
  char *pcVar6;
  char *in_R9;
  __0 *local_17b8;
  __1 *local_17a0;
  AssertHelper local_1160;
  Message local_1158;
  undefined1 local_1150 [8];
  AssertionResult gtest_ar_18;
  Message local_1138;
  int local_1130 [2];
  undefined1 local_1128 [8];
  AssertionResult gtest_ar_17;
  ASN1_STRING *str_1;
  Message local_1108;
  int local_1100 [2];
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar_16;
  undefined1 auStack_10e0 [7];
  ScopedTrace gtest_trace_1726;
  Bytes local_10d0;
  ScopedTrace local_10ba;
  ScopedTrace local_10b9;
  ScopedTrace gtest_trace_1725;
  anon_struct_40_3_b217a906 *paStack_10b8;
  ScopedTrace gtest_trace_1724;
  anon_struct_40_3_b217a906 *t_1;
  anon_struct_40_3_b217a906 *__end1_1;
  anon_struct_40_3_b217a906 *__begin1_1;
  anon_struct_40_3_b217a906 (*__range1_1) [11];
  iterator local_1090;
  size_type local_1088;
  allocator<unsigned_char> local_107d;
  uchar local_107c [4];
  iterator local_1078;
  size_type local_1070;
  allocator<unsigned_char> local_1063;
  uchar local_1062 [2];
  iterator local_1060;
  size_type local_1058;
  allocator<unsigned_char> local_104b;
  uchar local_104a [2];
  iterator local_1048;
  size_type local_1040;
  allocator<unsigned_char> local_1032;
  uchar local_1031;
  iterator local_1030;
  size_type local_1028;
  allocator<unsigned_char> local_101d;
  uchar local_101c [4];
  iterator local_1018;
  size_type local_1010;
  allocator<unsigned_char> local_1003;
  uchar local_1002 [2];
  iterator local_1000;
  size_type local_ff8;
  allocator<unsigned_char> local_fec;
  uchar local_feb [3];
  iterator local_fe8;
  size_type local_fe0;
  allocator<unsigned_char> local_fd2;
  uchar local_fd1;
  iterator local_fd0;
  size_type local_fc8;
  allocator<unsigned_char> local_fba;
  uchar local_fb9;
  iterator local_fb8;
  size_type local_fb0;
  allocator<unsigned_char> local_fa2;
  uchar local_fa1;
  iterator local_fa0;
  size_type local_f98;
  unsigned_long *local_f90;
  undefined1 local_f88 [8];
  anon_struct_40_3_b217a906 kInvalidTests [11];
  AssertHelper local_db0;
  Message local_da8;
  bool local_d99;
  undefined1 local_d98 [8];
  AssertionResult gtest_ar__4;
  Message local_d80;
  int local_d78 [2];
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_15;
  Message local_d58;
  int local_d50 [2];
  undefined1 local_d48 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_d18;
  Message local_d10;
  bool local_d01;
  undefined1 local_d00 [8];
  AssertionResult gtest_ar__3;
  Message local_ce8;
  int local_ce0 [2];
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar_13;
  Message local_cc0;
  int local_cb8 [2];
  undefined1 local_cb0 [8];
  AssertionResult gtest_ar_12;
  Message local_c98;
  Bytes local_c90;
  Span<const_unsigned_char> local_c80;
  Bytes local_c70;
  undefined1 local_c60 [8];
  AssertionResult gtest_ar_11;
  Message local_c48;
  int local_c3c;
  undefined1 local_c38 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_c08;
  Message local_c00;
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar__2;
  Message local_be0;
  int local_bd4;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_9;
  Message local_bb8;
  int local_bac;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_8;
  Message local_b90;
  Bytes local_b88;
  Span<const_unsigned_char> local_b78;
  Bytes local_b68;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_7;
  Message local_b40;
  int local_b34;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_6;
  Message local_b18;
  undefined1 local_b10 [8];
  AssertionResult gtest_ar_5;
  Message local_af8;
  int local_aec;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_4;
  ASN1_STRING *old_str;
  AssertHelper local_ab0;
  Message local_aa8;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar__1;
  Message local_a88;
  Bytes local_a80;
  Span<const_unsigned_char> local_a70;
  Bytes local_a60;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar_3;
  Message local_a38;
  int local_a2c;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_2;
  string local_a10;
  AssertHelper local_9f0;
  Message local_9e8;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_;
  Message local_9c8;
  int local_9bc;
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar_1;
  ASN1_STRING *str;
  Message local_998;
  int local_98c;
  undefined1 local_988 [8];
  AssertionResult gtest_ar;
  undefined1 auStack_970 [7];
  ScopedTrace gtest_trace_1621;
  Bytes local_960;
  ScopedTrace local_94a;
  ScopedTrace local_949;
  ScopedTrace gtest_trace_1620;
  anon_struct_80_6_342ef157 *paStack_948;
  ScopedTrace gtest_trace_1619;
  anon_struct_80_6_342ef157 *t;
  anon_struct_80_6_342ef157 *__end1;
  anon_struct_80_6_342ef157 *__begin1;
  anon_struct_80_6_342ef157 (*__range1) [18];
  uchar local_920 [16];
  iterator local_910;
  size_type local_908;
  allocator<unsigned_char> local_8fa;
  uchar local_8f9 [9];
  iterator local_8f0;
  size_type local_8e8;
  undefined1 local_8de;
  allocator<unsigned_char> local_8dd;
  uchar local_8dc [4];
  iterator local_8d8;
  size_type local_8d0;
  allocator<unsigned_char> local_8c2;
  uchar local_8c1;
  iterator local_8c0;
  size_type local_8b8;
  undefined1 local_8ac;
  allocator<unsigned_char> local_8ab;
  uchar local_8aa [2];
  iterator local_8a8;
  size_type local_8a0;
  allocator<unsigned_char> local_892;
  uchar local_891;
  iterator local_890;
  size_type local_888;
  undefined1 local_87b;
  allocator<unsigned_char> local_87a;
  uchar local_879;
  iterator local_878;
  size_type local_870;
  allocator<unsigned_char> local_862;
  uchar local_861;
  iterator local_860;
  size_type local_858;
  undefined1 local_84b;
  allocator<unsigned_char> local_84a;
  uchar local_849;
  iterator local_848;
  size_type local_840;
  allocator<unsigned_char> local_832;
  uchar local_831;
  iterator local_830;
  size_type local_828;
  undefined1 local_81b;
  allocator<unsigned_char> local_81a;
  uchar local_819;
  iterator local_818;
  size_type local_810;
  allocator<unsigned_char> local_802;
  uchar local_801;
  iterator local_800;
  size_type local_7f8;
  undefined1 local_7eb;
  allocator<unsigned_char> local_7ea;
  uchar local_7e9;
  iterator local_7e8;
  size_type local_7e0;
  allocator<unsigned_char> local_7d2;
  uchar local_7d1;
  iterator local_7d0;
  size_type local_7c8;
  undefined1 local_7bc;
  allocator<unsigned_char> local_7bb;
  uchar local_7ba [2];
  iterator local_7b8;
  size_type local_7b0;
  allocator<unsigned_char> local_7a3;
  uchar local_7a2 [2];
  iterator local_7a0;
  size_type local_798;
  undefined1 local_78b;
  allocator<unsigned_char> local_78a;
  uchar local_789;
  iterator local_788;
  size_type local_780;
  allocator<unsigned_char> local_772;
  uchar local_771;
  iterator local_770;
  size_type local_768;
  undefined1 local_75e;
  allocator<unsigned_char> local_75d;
  uchar local_75c [4];
  iterator local_758;
  size_type local_750;
  allocator<unsigned_char> local_745;
  uchar local_744 [4];
  iterator local_740;
  size_type local_738;
  undefined1 local_72e;
  allocator<unsigned_char> local_72d;
  uchar local_72c [4];
  iterator local_728;
  size_type local_720;
  allocator<unsigned_char> local_715;
  uchar local_714 [4];
  iterator local_710;
  size_type local_708;
  undefined1 local_6fc;
  allocator<unsigned_char> local_6fb;
  uchar local_6fa [2];
  iterator local_6f8;
  size_type local_6f0;
  allocator<unsigned_char> local_6e3;
  uchar local_6e2 [2];
  iterator local_6e0;
  size_type local_6d8;
  undefined1 local_6cb;
  allocator<unsigned_char> local_6ca;
  uchar local_6c9;
  iterator local_6c8;
  size_type local_6c0;
  allocator<unsigned_char> local_6b3;
  uchar local_6b2 [2];
  iterator local_6b0;
  size_type local_6a8;
  undefined1 local_69b;
  allocator<unsigned_char> local_69a;
  uchar local_699;
  iterator local_698;
  size_type local_690;
  allocator<unsigned_char> local_682;
  uchar local_681;
  iterator local_680;
  size_type local_678;
  undefined1 local_66b;
  allocator<unsigned_char> local_66a;
  uchar local_669;
  iterator local_668;
  size_type local_660;
  allocator<unsigned_char> local_652;
  uchar local_651;
  iterator local_650;
  size_type local_648;
  undefined1 local_640;
  allocator<unsigned_char> local_63f;
  uchar local_63e [14];
  iterator local_630;
  size_type local_628;
  allocator<unsigned_char> local_61f;
  uchar local_61e [14];
  iterator local_610;
  size_type local_608;
  undefined1 local_5fb;
  allocator<unsigned_char> local_5fa;
  uchar local_5f9;
  iterator local_5f8;
  size_type local_5f0;
  allocator<unsigned_char> local_5d2;
  uchar local_5d1;
  iterator local_5d0;
  size_type local_5c8;
  int *local_5c0;
  undefined1 local_5b8 [8];
  anon_struct_80_6_342ef157 kTests [18];
  unsigned_long kAll;
  ASN1Test_MBString_Test *this_local;
  
  kTests[0x11].num_codepoints = 0x2916;
  kTests[0x11]._76_4_ = 0;
  __range1._5_1_ = 1;
  local_5c0 = (int *)local_5b8;
  local_5b8._0_4_ = 0x1000;
  kTests[0].format = 0;
  kTests[0]._4_4_ = 0;
  kTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  kTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)kTests);
  kTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[0].mask._0_4_ = 0x13;
  kTests[0].expected_type = 0;
  kTests[0]._44_4_ = 0;
  kTests[0].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  kTests[0].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0].expected_type);
  kTests[0].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_5c0 = &kTests[0].num_codepoints;
  kTests[0].num_codepoints = 0x1000;
  local_5d1 = 'a';
  local_5d0 = &local_5d1;
  local_5c8 = 1;
  std::allocator<unsigned_char>::allocator(&local_5d2);
  __l_43._M_len = local_5c8;
  __l_43._M_array = local_5d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 1),__l_43,&local_5d2
            );
  local_5fb = 1;
  kTests[1].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[1].mask._0_4_ = 0x13;
  local_5f9 = 'a';
  local_5f8 = &local_5f9;
  local_5f0 = 1;
  std::allocator<unsigned_char>::allocator(&local_5fa);
  __l_42._M_len = local_5f0;
  __l_42._M_array = local_5f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[1].expected_type,
             __l_42,&local_5fa);
  kTests[1].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_5fb = 0;
  local_5c0 = &kTests[1].num_codepoints;
  kTests[1].num_codepoints = 0x1000;
  builtin_memcpy(local_61e,"aA0\'()+,-./:=?",0xe);
  local_610 = local_61e;
  local_608 = 0xe;
  std::allocator<unsigned_char>::allocator(&local_61f);
  __l_41._M_len = local_608;
  __l_41._M_array = local_610;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 2),__l_41,&local_61f
            );
  local_640 = 1;
  kTests[2].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[2].mask._0_4_ = 0x13;
  builtin_memcpy(local_63e,"aA0\'()+,-./:=?",0xe);
  local_630 = local_63e;
  local_628 = 0xe;
  std::allocator<unsigned_char>::allocator(&local_63f);
  __l_40._M_len = local_628;
  __l_40._M_array = local_630;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[2].expected_type,
             __l_40,&local_63f);
  kTests[2].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xe;
  local_640 = 0;
  local_5c0 = &kTests[2].num_codepoints;
  kTests[2].num_codepoints = 0x1000;
  local_651 = '*';
  local_650 = &local_651;
  local_648 = 1;
  std::allocator<unsigned_char>::allocator(&local_652);
  __l_39._M_len = local_648;
  __l_39._M_array = local_650;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 3),__l_39,&local_652
            );
  local_66b = 1;
  kTests[3].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[3].mask._0_4_ = 0x16;
  local_669 = '*';
  local_668 = &local_669;
  local_660 = 1;
  std::allocator<unsigned_char>::allocator(&local_66a);
  __l_38._M_len = local_660;
  __l_38._M_array = local_668;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[3].expected_type,
             __l_38,&local_66a);
  kTests[3].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_66b = 0;
  local_5c0 = &kTests[3].num_codepoints;
  kTests[3].num_codepoints = 0x1000;
  local_681 = '\n';
  local_680 = &local_681;
  local_678 = 1;
  std::allocator<unsigned_char>::allocator(&local_682);
  __l_37._M_len = local_678;
  __l_37._M_array = local_680;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 4),__l_37,&local_682
            );
  local_69b = 1;
  kTests[4].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[4].mask._0_4_ = 0x16;
  local_699 = '\n';
  local_698 = &local_699;
  local_690 = 1;
  std::allocator<unsigned_char>::allocator(&local_69a);
  __l_36._M_len = local_690;
  __l_36._M_array = local_698;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[4].expected_type,
             __l_36,&local_69a);
  kTests[4].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_69b = 0;
  local_5c0 = &kTests[4].num_codepoints;
  kTests[4].num_codepoints = 0x1000;
  local_6b2[0] = 0xc2;
  local_6b2[1] = 0x80;
  local_6b0 = local_6b2;
  local_6a8 = 2;
  std::allocator<unsigned_char>::allocator(&local_6b3);
  __l_35._M_len = local_6a8;
  __l_35._M_array = local_6b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 5),__l_35,&local_6b3
            );
  local_6cb = 1;
  kTests[5].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[5].mask._0_4_ = 0x14;
  local_6c9 = 0x80;
  local_6c8 = &local_6c9;
  local_6c0 = 1;
  std::allocator<unsigned_char>::allocator(&local_6ca);
  __l_34._M_len = local_6c0;
  __l_34._M_array = local_6c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[5].expected_type,
             __l_34,&local_6ca);
  kTests[5].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_6cb = 0;
  local_5c0 = &kTests[5].num_codepoints;
  kTests[5].num_codepoints = 0x1000;
  local_6e2[0] = 0xc4;
  local_6e2[1] = 0x80;
  local_6e0 = local_6e2;
  local_6d8 = 2;
  std::allocator<unsigned_char>::allocator(&local_6e3);
  __l_33._M_len = local_6d8;
  __l_33._M_array = local_6e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 6),__l_33,&local_6e3
            );
  local_6fc = 1;
  kTests[6].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[6].mask._0_4_ = 0x1e;
  local_6fa[0] = '\x01';
  local_6fa[1] = 0;
  local_6f8 = local_6fa;
  local_6f0 = 2;
  std::allocator<unsigned_char>::allocator(&local_6fb);
  __l_32._M_len = local_6f0;
  __l_32._M_array = local_6f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[6].expected_type,
             __l_32,&local_6fb);
  kTests[6].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_6fc = 0;
  local_5c0 = &kTests[6].num_codepoints;
  kTests[6].num_codepoints = 0x1000;
  builtin_memcpy(local_714,"𐀀",4);
  local_710 = local_714;
  local_708 = 4;
  std::allocator<unsigned_char>::allocator(&local_715);
  __l_31._M_len = local_708;
  __l_31._M_array = local_710;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 7),__l_31,&local_715
            );
  local_72e = 1;
  kTests[7].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[7].mask._0_4_ = 0x1c;
  local_72c[0] = '\0';
  local_72c[1] = 1;
  local_72c[2] = 0;
  local_72c[3] = 0;
  local_728 = local_72c;
  local_720 = 4;
  std::allocator<unsigned_char>::allocator(&local_72d);
  __l_30._M_len = local_720;
  __l_30._M_array = local_728;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[7].expected_type,
             __l_30,&local_72d);
  kTests[7].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_72e = 0;
  local_5c0 = &kTests[7].num_codepoints;
  kTests[7].num_codepoints = 0x1000;
  builtin_memcpy(local_744,"𐀀",4);
  local_740 = local_744;
  local_738 = 4;
  std::allocator<unsigned_char>::allocator(&local_745);
  __l_29._M_len = local_738;
  __l_29._M_array = local_740;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 8),__l_29,&local_745
            );
  local_75e = 1;
  kTests[8].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2816;
  kTests[8].mask._0_4_ = 0xc;
  builtin_memcpy(local_75c,"𐀀",4);
  local_758 = local_75c;
  local_750 = 4;
  std::allocator<unsigned_char>::allocator(&local_75d);
  __l_28._M_len = local_750;
  __l_28._M_array = local_758;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[8].expected_type,
             __l_28,&local_75d);
  kTests[8].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_75e = 0;
  local_5c0 = &kTests[8].num_codepoints;
  kTests[8].num_codepoints = 0x1000;
  local_771 = '\0';
  local_770 = &local_771;
  local_768 = 1;
  std::allocator<unsigned_char>::allocator(&local_772);
  __l_27._M_len = local_768;
  __l_27._M_array = local_770;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 9),__l_27,&local_772
            );
  local_78b = 1;
  kTests[9].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[9].mask._0_4_ = 0x16;
  local_789 = '\0';
  local_788 = &local_789;
  local_780 = 1;
  std::allocator<unsigned_char>::allocator(&local_78a);
  __l_26._M_len = local_780;
  __l_26._M_array = local_788;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[9].expected_type,
             __l_26,&local_78a);
  kTests[9].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_78b = 0;
  local_5c0 = &kTests[9].num_codepoints;
  kTests[9].num_codepoints = 0x1000;
  local_7a2[0] = '\0';
  local_7a2[1] = 0x61;
  local_7a0 = local_7a2;
  local_798 = 2;
  std::allocator<unsigned_char>::allocator(&local_7a3);
  __l_25._M_len = local_798;
  __l_25._M_array = local_7a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 10),__l_25,
             &local_7a3);
  local_7bc = 1;
  kTests[10].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2916;
  kTests[10].mask._0_4_ = 0x16;
  local_7ba[0] = '\0';
  local_7ba[1] = 0x61;
  local_7b8 = local_7ba;
  local_7b0 = 2;
  std::allocator<unsigned_char>::allocator(&local_7bb);
  __l_24._M_len = local_7b0;
  __l_24._M_array = local_7b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[10].expected_type,
             __l_24,&local_7bb);
  kTests[10].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  local_7bc = 0;
  local_5c0 = &kTests[10].num_codepoints;
  kTests[10].num_codepoints = 0x1000;
  local_7d1 = 'a';
  local_7d0 = &local_7d1;
  local_7c8 = 1;
  std::allocator<unsigned_char>::allocator(&local_7d2);
  __l_23._M_len = local_7c8;
  __l_23._M_array = local_7d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0xb),__l_23,
             &local_7d2);
  local_7eb = 1;
  kTests[0xb].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  kTests[0xb].mask._0_4_ = 0x13;
  local_7e9 = 'a';
  local_7e8 = &local_7e9;
  local_7e0 = 1;
  std::allocator<unsigned_char>::allocator(&local_7ea);
  __l_22._M_len = local_7e0;
  __l_22._M_array = local_7e8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0xb].expected_type,
             __l_22,&local_7ea);
  kTests[0xb].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_7eb = 0;
  local_5c0 = &kTests[0xb].num_codepoints;
  kTests[0xb].num_codepoints = 0x1000;
  local_801 = 'a';
  local_800 = &local_801;
  local_7f8 = 1;
  std::allocator<unsigned_char>::allocator(&local_802);
  __l_21._M_len = local_7f8;
  __l_21._M_array = local_800;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0xc),__l_21,
             &local_802);
  local_81b = 1;
  kTests[0xc].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x10;
  kTests[0xc].mask._0_4_ = 0x16;
  local_819 = 'a';
  local_818 = &local_819;
  local_810 = 1;
  std::allocator<unsigned_char>::allocator(&local_81a);
  __l_20._M_len = local_810;
  __l_20._M_array = local_818;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0xc].expected_type,
             __l_20,&local_81a);
  kTests[0xc].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_81b = 0;
  local_5c0 = &kTests[0xc].num_codepoints;
  kTests[0xc].num_codepoints = 0x1000;
  local_831 = 'a';
  local_830 = &local_831;
  local_828 = 1;
  std::allocator<unsigned_char>::allocator(&local_832);
  __l_19._M_len = local_828;
  __l_19._M_array = local_830;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0xd),__l_19,
             &local_832);
  local_84b = 1;
  kTests[0xd].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  kTests[0xd].mask._0_4_ = 0x14;
  local_849 = 'a';
  local_848 = &local_849;
  local_840 = 1;
  std::allocator<unsigned_char>::allocator(&local_84a);
  __l_18._M_len = local_840;
  __l_18._M_array = local_848;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0xd].expected_type,
             __l_18,&local_84a);
  kTests[0xd].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_84b = 0;
  local_5c0 = &kTests[0xd].num_codepoints;
  kTests[0xd].num_codepoints = 0x1000;
  local_861 = 'a';
  local_860 = &local_861;
  local_858 = 1;
  std::allocator<unsigned_char>::allocator(&local_862);
  __l_17._M_len = local_858;
  __l_17._M_array = local_860;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0xe),__l_17,
             &local_862);
  local_87b = 1;
  kTests[0xe].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  kTests[0xe].mask._0_4_ = 0xc;
  local_879 = 'a';
  local_878 = &local_879;
  local_870 = 1;
  std::allocator<unsigned_char>::allocator(&local_87a);
  __l_16._M_len = local_870;
  __l_16._M_array = local_878;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0xe].expected_type,
             __l_16,&local_87a);
  kTests[0xe].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_87b = 0;
  local_5c0 = &kTests[0xe].num_codepoints;
  kTests[0xe].num_codepoints = 0x1000;
  local_891 = 'a';
  local_890 = &local_891;
  local_888 = 1;
  std::allocator<unsigned_char>::allocator(&local_892);
  __l_15._M_len = local_888;
  __l_15._M_array = local_890;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0xf),__l_15,
             &local_892);
  local_8ac = 1;
  kTests[0xf].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x800;
  kTests[0xf].mask._0_4_ = 0x1e;
  local_8aa[0] = '\0';
  local_8aa[1] = 0x61;
  local_8a8 = local_8aa;
  local_8a0 = 2;
  std::allocator<unsigned_char>::allocator(&local_8ab);
  __l_14._M_len = local_8a0;
  __l_14._M_array = local_8a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0xf].expected_type,
             __l_14,&local_8ab);
  kTests[0xf].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_8ac = 0;
  local_5c0 = &kTests[0xf].num_codepoints;
  kTests[0xf].num_codepoints = 0x1000;
  local_8c1 = 'a';
  local_8c0 = &local_8c1;
  local_8b8 = 1;
  std::allocator<unsigned_char>::allocator(&local_8c2);
  __l_13._M_len = local_8b8;
  __l_13._M_array = local_8c0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0x10),__l_13,
             &local_8c2);
  local_8de = 1;
  kTests[0x10].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x100;
  kTests[0x10].mask._0_4_ = 0x1c;
  local_8dc[0] = '\0';
  local_8dc[1] = 0;
  local_8dc[2] = 0;
  local_8dc[3] = 0x61;
  local_8d8 = local_8dc;
  local_8d0 = 4;
  std::allocator<unsigned_char>::allocator(&local_8dd);
  __l_12._M_len = local_8d0;
  __l_12._M_array = local_8d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0x10].expected_type,
             __l_12,&local_8dd);
  kTests[0x10].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  local_8de = 0;
  local_5c0 = &kTests[0x10].num_codepoints;
  kTests[0x10].num_codepoints = 0x1000;
  builtin_memcpy(local_8f9,"a\x80Ā𐀀",9);
  local_8f0 = local_8f9;
  local_8e8 = 9;
  std::allocator<unsigned_char>::allocator(&local_8fa);
  __l_11._M_len = local_8e8;
  __l_11._M_array = local_8f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 0x11),__l_11,
             &local_8fa);
  __range1._6_1_ = 1;
  kTests[0x11].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x100;
  kTests[0x11].mask._0_4_ = 0x1c;
  local_920[0] = '\0';
  local_920[1] = 0;
  local_920[2] = 0;
  local_920[3] = 0x61;
  local_920[4] = 0;
  local_920[5] = 0;
  local_920[6] = 0;
  local_920[7] = 0x80;
  local_920[8] = 0;
  local_920[9] = 0;
  local_920[10] = 1;
  local_920[0xb] = 0;
  local_920[0xc] = 0;
  local_920[0xd] = 1;
  local_920[0xe] = 0;
  local_920[0xf] = 0;
  local_910 = local_920;
  local_908 = 0x10;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  __l_10._M_len = local_908;
  __l_10._M_array = local_910;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&kTests[0x11].expected_type,
             __l_10,(allocator<unsigned_char> *)((long)&__range1 + 7));
  kTests[0x11].expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  __range1._6_1_ = 0;
  __range1._5_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  std::allocator<unsigned_char>::~allocator(&local_8fa);
  std::allocator<unsigned_char>::~allocator(&local_8dd);
  std::allocator<unsigned_char>::~allocator(&local_8c2);
  std::allocator<unsigned_char>::~allocator(&local_8ab);
  std::allocator<unsigned_char>::~allocator(&local_892);
  std::allocator<unsigned_char>::~allocator(&local_87a);
  std::allocator<unsigned_char>::~allocator(&local_862);
  std::allocator<unsigned_char>::~allocator(&local_84a);
  std::allocator<unsigned_char>::~allocator(&local_832);
  std::allocator<unsigned_char>::~allocator(&local_81a);
  std::allocator<unsigned_char>::~allocator(&local_802);
  std::allocator<unsigned_char>::~allocator(&local_7ea);
  std::allocator<unsigned_char>::~allocator(&local_7d2);
  std::allocator<unsigned_char>::~allocator(&local_7bb);
  std::allocator<unsigned_char>::~allocator(&local_7a3);
  std::allocator<unsigned_char>::~allocator(&local_78a);
  std::allocator<unsigned_char>::~allocator(&local_772);
  std::allocator<unsigned_char>::~allocator(&local_75d);
  std::allocator<unsigned_char>::~allocator(&local_745);
  std::allocator<unsigned_char>::~allocator(&local_72d);
  std::allocator<unsigned_char>::~allocator(&local_715);
  std::allocator<unsigned_char>::~allocator(&local_6fb);
  std::allocator<unsigned_char>::~allocator(&local_6e3);
  std::allocator<unsigned_char>::~allocator(&local_6ca);
  std::allocator<unsigned_char>::~allocator(&local_6b3);
  std::allocator<unsigned_char>::~allocator(&local_69a);
  std::allocator<unsigned_char>::~allocator(&local_682);
  std::allocator<unsigned_char>::~allocator(&local_66a);
  std::allocator<unsigned_char>::~allocator(&local_652);
  std::allocator<unsigned_char>::~allocator(&local_63f);
  std::allocator<unsigned_char>::~allocator(&local_61f);
  std::allocator<unsigned_char>::~allocator(&local_5fa);
  std::allocator<unsigned_char>::~allocator(&local_5d2);
  for (__end1 = (anon_struct_80_6_342ef157 *)local_5b8;
      __end1 != (anon_struct_80_6_342ef157 *)&kTests[0x11].num_codepoints; __end1 = __end1 + 1) {
    paStack_948 = __end1;
    testing::ScopedTrace::ScopedTrace<int>
              (&local_949,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x653,&__end1->format);
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)auStack_970,&paStack_948->in);
    Bytes::Bytes(&local_960,_auStack_970);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_94a,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x654,&local_960);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x655,&paStack_948->mask);
    piVar3 = &paStack_948->expected_type;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_948->in);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_948->in);
    local_98c = ASN1_mbstring_copy((ASN1_STRING **)0x0,puVar4,(int)sVar5,paStack_948->format,
                                   paStack_948->mask);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_988,"t.expected_type",
               "ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(), t.format, t.mask)",piVar3,
               &local_98c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
    if (!bVar1) {
      testing::Message::Message(&local_998);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x65a,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str,&local_998);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str);
      testing::Message::~Message(&local_998);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    piVar3 = &paStack_948->expected_type;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_948->in);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_948->in);
    local_9bc = ASN1_mbstring_copy((ASN1_STRING **)&gtest_ar_1.message_,puVar4,(int)sVar5,
                                   paStack_948->format,paStack_948->mask);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_9b8,"t.expected_type",
               "ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask)",piVar3,
               &local_9bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b8);
    if (!bVar1) {
      testing::Message::Message(&local_9c8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_9b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x660,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_9c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_9c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b8);
    testing::AssertionResult::AssertionResult<asn1_string_st*>
              ((AssertionResult *)local_9e0,(asn1_string_st **)&gtest_ar_1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
    if (!bVar1) {
      testing::Message::Message(&local_9e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a10,(internal *)local_9e0,(AssertionResult *)0x8244ba,"false","true",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_9f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x661,pcVar6);
      testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
      testing::internal::AssertHelper::~AssertHelper(&local_9f0);
      std::__cxx11::string::~string((string *)&local_a10);
      testing::Message::~Message(&local_9e8);
    }
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
    if (gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      piVar3 = &paStack_948->expected_type;
      local_a2c = ASN1_STRING_type((ASN1_STRING *)
                                   gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_a28,"t.expected_type","ASN1_STRING_type(str)",piVar3,&local_a2c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
      if (!bVar1) {
        testing::Message::Message(&local_a38);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x662,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_a38);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
      bssl::Span<unsigned_char_const>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<unsigned_char_const> *)&local_a70,&paStack_948->expected_data);
      Bytes::Bytes(&local_a60,local_a70);
      puVar4 = ASN1_STRING_get0_data
                         ((ASN1_STRING *)
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      iVar2 = ASN1_STRING_length((ASN1_STRING *)
                                 gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      Bytes::Bytes(&local_a80,puVar4,(long)iVar2);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_a50,"Bytes(t.expected_data)",
                 "Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str))",&local_a60,&local_a80)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
      if (!bVar1) {
        testing::Message::Message(&local_a88);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_a50);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x664,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_a88)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_a88);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
      ASN1_STRING_free((ASN1_STRING *)
                       gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )ASN1_STRING_new();
      testing::AssertionResult::AssertionResult<asn1_string_st*>
                ((AssertionResult *)local_aa0,(asn1_string_st **)&gtest_ar_1.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
      if (!bVar1) {
        testing::Message::Message(&local_aa8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&old_str,(internal *)local_aa0,(AssertionResult *)0x8244ba,"false",
                   "true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_ab0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x669,pcVar6);
        testing::internal::AssertHelper::operator=(&local_ab0,&local_aa8);
        testing::internal::AssertHelper::~AssertHelper(&local_ab0);
        std::__cxx11::string::~string((string *)&old_str);
        testing::Message::~Message(&local_aa8);
      }
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
      if (gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        gtest_ar_4.message_ = gtest_ar_1.message_;
        piVar3 = &paStack_948->expected_type;
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_948->in);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_948->in);
        local_aec = ASN1_mbstring_copy((ASN1_STRING **)&gtest_ar_1.message_,puVar4,(int)sVar5,
                                       paStack_948->format,paStack_948->mask);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_ae8,"t.expected_type",
                   "ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask)",piVar3,
                   &local_aec);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
        if (!bVar1) {
          testing::Message::Message(&local_af8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x66d,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_af8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_af8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
        testing::internal::EqHelper::Compare<asn1_string_st_*,_asn1_string_st_*,_nullptr>
                  ((EqHelper *)local_b10,"old_str","str",(asn1_string_st **)&gtest_ar_4.message_,
                   (asn1_string_st **)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b10);
        if (!bVar1) {
          testing::Message::Message(&local_b18);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x66e,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_b18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_b18);
        }
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
        if (gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          piVar3 = &paStack_948->expected_type;
          local_b34 = ASN1_STRING_type((ASN1_STRING *)
                                       gtest_ar_1.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_b30,"t.expected_type","ASN1_STRING_type(str)",piVar3,
                     &local_b34);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
          if (!bVar1) {
            testing::Message::Message(&local_b40);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x66f,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_b40);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_b40);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
          bssl::Span<unsigned_char_const>::
          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char_const> *)&local_b78,&paStack_948->expected_data);
          Bytes::Bytes(&local_b68,local_b78);
          puVar4 = ASN1_STRING_get0_data
                             ((ASN1_STRING *)
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
          iVar2 = ASN1_STRING_length((ASN1_STRING *)
                                     gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
          Bytes::Bytes(&local_b88,puVar4,(long)iVar2);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_b58,"Bytes(t.expected_data)",
                     "Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str))",&local_b68,
                     &local_b88);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
          if (!bVar1) {
            testing::Message::Message(&local_b90);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b58);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x671,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_b90);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_b90);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
          ASN1_STRING_free((ASN1_STRING *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          piVar3 = &paStack_948->expected_type;
          puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&paStack_948->in);
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_948->in)
          ;
          local_bac = ASN1_mbstring_ncopy((ASN1_STRING **)0x0,puVar4,(int)sVar5,paStack_948->format,
                                          paStack_948->mask,(long)paStack_948->num_codepoints,
                                          (long)paStack_948->num_codepoints);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_ba8,"t.expected_type",
                     "ASN1_mbstring_ncopy(nullptr, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints, t.num_codepoints)"
                     ,piVar3,&local_bac);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
          if (!bVar1) {
            testing::Message::Message(&local_bb8);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x679,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_bb8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_bb8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
          piVar3 = &paStack_948->expected_type;
          puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&paStack_948->in);
          sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_948->in)
          ;
          in_R9 = (char *)(long)paStack_948->num_codepoints;
          local_bd4 = ASN1_mbstring_ncopy((ASN1_STRING **)&gtest_ar_1.message_,puVar4,(int)sVar5,
                                          paStack_948->format,paStack_948->mask,(long)in_R9,
                                          (long)in_R9);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_bd0,"t.expected_type",
                     "ASN1_mbstring_ncopy(&str, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints, t.num_codepoints)"
                     ,piVar3,&local_bd4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
          if (!bVar1) {
            testing::Message::Message(&local_be0);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_bd0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x67e,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__2.message_,&local_be0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_be0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
          testing::AssertionResult::AssertionResult<asn1_string_st*>
                    ((AssertionResult *)local_bf8,(asn1_string_st **)&gtest_ar_1.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
          if (!bVar1) {
            testing::Message::Message(&local_c00);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_10.message_,(internal *)local_bf8,
                       (AssertionResult *)0x8244ba,"false","true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_c08,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x67f,pcVar6);
            testing::internal::AssertHelper::operator=(&local_c08,&local_c00);
            testing::internal::AssertHelper::~AssertHelper(&local_c08);
            std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
            testing::Message::~Message(&local_c00);
          }
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
          if (gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            piVar3 = &paStack_948->expected_type;
            local_c3c = ASN1_STRING_type((ASN1_STRING *)
                                         gtest_ar_1.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_c38,"t.expected_type","ASN1_STRING_type(str)",piVar3,
                       &local_c3c);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c38);
            if (!bVar1) {
              testing::Message::Message(&local_c48);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_c38);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x680,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_11.message_,&local_c48);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
              testing::Message::~Message(&local_c48);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_c38);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_c80,&paStack_948->expected_data);
            Bytes::Bytes(&local_c70,local_c80);
            puVar4 = ASN1_STRING_get0_data
                               ((ASN1_STRING *)
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
            iVar2 = ASN1_STRING_length((ASN1_STRING *)
                                       gtest_ar_1.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl);
            Bytes::Bytes(&local_c90,puVar4,(long)iVar2);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_c60,"Bytes(t.expected_data)",
                       "Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str))",&local_c70,
                       &local_c90);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c60);
            if (!bVar1) {
              testing::Message::Message(&local_c98);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_c60);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x682,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_12.message_,&local_c98);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
              testing::Message::~Message(&local_c98);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_c60);
            ASN1_STRING_free((ASN1_STRING *)
                             gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_cb8[1] = 0xffffffff;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&paStack_948->in);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&paStack_948->in);
            local_cb8[0] = ASN1_mbstring_ncopy((ASN1_STRING **)0x0,puVar4,(int)sVar5,
                                               paStack_948->format,paStack_948->mask,
                                               (long)(paStack_948->num_codepoints + 1),0);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_cb0,"-1",
                       "ASN1_mbstring_ncopy( nullptr, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints + 1, 0)"
                       ,local_cb8 + 1,local_cb8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
            if (!bVar1) {
              testing::Message::Message(&local_cc0);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_cb0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x688,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_13.message_,&local_cc0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
              testing::Message::~Message(&local_cc0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
            ERR_clear_error();
            local_ce0[1] = 0xffffffff;
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&paStack_948->in);
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&paStack_948->in);
            in_R9 = (char *)(long)(paStack_948->num_codepoints + 1);
            local_ce0[0] = ASN1_mbstring_ncopy((ASN1_STRING **)&gtest_ar_1.message_,puVar4,
                                               (int)sVar5,paStack_948->format,paStack_948->mask,
                                               (long)in_R9,0);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_cd8,"-1",
                       "ASN1_mbstring_ncopy( &str, t.in.data(), t.in.size(), t.format, t.mask, t.num_codepoints + 1, 0)"
                       ,local_ce0 + 1,local_ce0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
            if (!bVar1) {
              testing::Message::Message(&local_ce8);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_cd8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x68c,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__3.message_,&local_ce8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_ce8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
            local_d01 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_d00,&local_d01,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d00);
            if (!bVar1) {
              testing::Message::Message(&local_d10);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_14.message_,(internal *)local_d00,
                         (AssertionResult *)0x8244ba,"true","false",in_R9);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_d18,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                         ,0x68d,pcVar6);
              testing::internal::AssertHelper::operator=(&local_d18,&local_d10);
              testing::internal::AssertHelper::~AssertHelper(&local_d18);
              std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
              testing::Message::~Message(&local_d10);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_d00);
            ERR_clear_error();
            if (1 < paStack_948->num_codepoints) {
              local_d50[1] = 0xffffffff;
              puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 (&paStack_948->in);
              sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (&paStack_948->in);
              local_d50[0] = ASN1_mbstring_ncopy((ASN1_STRING **)0x0,puVar4,(int)sVar5,
                                                 paStack_948->format,paStack_948->mask,0,
                                                 (long)(paStack_948->num_codepoints + -1));
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_d48,"-1",
                         "ASN1_mbstring_ncopy( nullptr, t.in.data(), t.in.size(), t.format, t.mask, 0, t.num_codepoints - 1)"
                         ,local_d50 + 1,local_d50);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d48);
              if (!bVar1) {
                testing::Message::Message(&local_d58);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_d48);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x692,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_15.message_,&local_d58);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_15.message_);
                testing::Message::~Message(&local_d58);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_d48);
              ERR_clear_error();
              local_d78[1] = 0xffffffff;
              puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 (&paStack_948->in);
              sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (&paStack_948->in);
              in_R9 = (char *)0x0;
              local_d78[0] = ASN1_mbstring_ncopy((ASN1_STRING **)&gtest_ar_1.message_,puVar4,
                                                 (int)sVar5,paStack_948->format,paStack_948->mask,0,
                                                 (long)(paStack_948->num_codepoints + -1));
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_d70,"-1",
                         "ASN1_mbstring_ncopy( &str, t.in.data(), t.in.size(), t.format, t.mask, 0, t.num_codepoints - 1)"
                         ,local_d78 + 1,local_d78);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d70);
              if (!bVar1) {
                testing::Message::Message(&local_d80);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_d70);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x696,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__4.message_,&local_d80);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__4.message_);
                testing::Message::~Message(&local_d80);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_d70);
              local_d99 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_d98,&local_d99,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d98);
              if (!bVar1) {
                testing::Message::Message(&local_da8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&kInvalidTests[10].mask,(internal *)local_d98,
                           (AssertionResult *)0x8244ba,"true","false",in_R9);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_db0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                           ,0x697,pcVar6);
                testing::internal::AssertHelper::operator=(&local_db0,&local_da8);
                testing::internal::AssertHelper::~AssertHelper(&local_db0);
                std::__cxx11::string::~string((string *)&kInvalidTests[10].mask);
                testing::Message::~Message(&local_da8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_d98);
              ERR_clear_error();
            }
            gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    testing::ScopedTrace::~ScopedTrace(&local_94a);
    testing::ScopedTrace::~ScopedTrace(&local_949);
    if (gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_001f9e09;
  }
  __range1_1._5_1_ = 1;
  local_f90 = (unsigned_long *)local_f88;
  local_f88._0_4_ = 0x1000;
  local_fa1 = 0xff;
  local_fa0 = &local_fa1;
  local_f98 = 1;
  std::allocator<unsigned_char>::allocator(&local_fa2);
  __l_09._M_len = local_f98;
  __l_09._M_array = local_fa0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)kInvalidTests,__l_09,
             &local_fa2);
  kInvalidTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  local_f90 = &kInvalidTests[0].mask;
  kInvalidTests[0].mask._0_4_ = 0x1002;
  local_fb9 = 0xff;
  local_fb8 = &local_fb9;
  local_fb0 = 1;
  std::allocator<unsigned_char>::allocator(&local_fba);
  __l_08._M_len = local_fb0;
  __l_08._M_array = local_fb8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 1),__l_08,
             &local_fba);
  kInvalidTests[1].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  local_f90 = &kInvalidTests[1].mask;
  kInvalidTests[1].mask._0_4_ = 0x1004;
  local_fd1 = 0xff;
  local_fd0 = &local_fd1;
  local_fc8 = 1;
  std::allocator<unsigned_char>::allocator(&local_fd2);
  __l_07._M_len = local_fc8;
  __l_07._M_array = local_fd0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 2),__l_07,
             &local_fd2);
  kInvalidTests[2].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  local_f90 = &kInvalidTests[2].mask;
  kInvalidTests[2].mask._0_4_ = 0x1000;
  local_feb[0] = 0xed;
  local_feb[1] = 0xa0;
  local_feb[2] = 0x80;
  local_fe8 = local_feb;
  local_fe0 = 3;
  std::allocator<unsigned_char>::allocator(&local_fec);
  __l_06._M_len = local_fe0;
  __l_06._M_array = local_fe8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 3),__l_06,
             &local_fec);
  kInvalidTests[3].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  local_f90 = &kInvalidTests[3].mask;
  kInvalidTests[3].mask._0_4_ = 0x1002;
  local_1002[0] = 0xd8;
  local_1002[1] = 0;
  local_1000 = local_1002;
  local_ff8 = 2;
  std::allocator<unsigned_char>::allocator(&local_1003);
  __l_05._M_len = local_ff8;
  __l_05._M_array = local_1000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 4),__l_05,
             &local_1003);
  kInvalidTests[4].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  local_f90 = &kInvalidTests[4].mask;
  kInvalidTests[4].mask._0_4_ = 0x1004;
  local_101c[0] = '\0';
  local_101c[1] = 0;
  local_101c[2] = 0xd8;
  local_101c[3] = 0;
  local_1018 = local_101c;
  local_1010 = 4;
  std::allocator<unsigned_char>::allocator(&local_101d);
  __l_04._M_len = local_1010;
  __l_04._M_array = local_1018;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 5),__l_04,
             &local_101d);
  kInvalidTests[5].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2000;
  local_f90 = &kInvalidTests[5].mask;
  kInvalidTests[5].mask._0_4_ = 0x1000;
  local_1031 = '\n';
  local_1030 = &local_1031;
  local_1028 = 1;
  std::allocator<unsigned_char>::allocator(&local_1032);
  __l_03._M_len = local_1028;
  __l_03._M_array = local_1030;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 6),__l_03,
             &local_1032);
  kInvalidTests[6].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_f90 = &kInvalidTests[6].mask;
  kInvalidTests[6].mask._0_4_ = 0x1000;
  local_104a[0] = 0xc2;
  local_104a[1] = 0x80;
  local_1048 = local_104a;
  local_1040 = 2;
  std::allocator<unsigned_char>::allocator(&local_104b);
  __l_02._M_len = local_1040;
  __l_02._M_array = local_1048;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 7),__l_02,
             &local_104b);
  kInvalidTests[7].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x12;
  local_f90 = &kInvalidTests[7].mask;
  kInvalidTests[7].mask._0_4_ = 0x1000;
  local_1062[0] = 0xc4;
  local_1062[1] = 0x80;
  local_1060 = local_1062;
  local_1058 = 2;
  std::allocator<unsigned_char>::allocator(&local_1063);
  __l_01._M_len = local_1058;
  __l_01._M_array = local_1060;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 8),__l_01,
             &local_1063);
  kInvalidTests[8].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x16;
  local_f90 = &kInvalidTests[8].mask;
  kInvalidTests[8].mask._0_4_ = 0x1000;
  builtin_memcpy(local_107c,"𐀀",4);
  local_1078 = local_107c;
  local_1070 = 4;
  std::allocator<unsigned_char>::allocator(&local_107d);
  __l_00._M_len = local_1070;
  __l_00._M_array = local_1078;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 9),__l_00,
             &local_107d);
  kInvalidTests[9].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x816;
  local_f90 = &kInvalidTests[9].mask;
  kInvalidTests[9].mask._0_4_ = 0x1000;
  __range1_1._7_1_ = 10;
  local_1090 = (iterator)((long)&__range1_1 + 7);
  local_1088 = 1;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1_1 + 6));
  __l._M_len = local_1088;
  __l._M_array = local_1090;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kInvalidTests + 10),__l,
             (allocator<unsigned_char> *)((long)&__range1_1 + 6));
  kInvalidTests[10].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x10002;
  __range1_1._5_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1_1 + 6));
  std::allocator<unsigned_char>::~allocator(&local_107d);
  std::allocator<unsigned_char>::~allocator(&local_1063);
  std::allocator<unsigned_char>::~allocator(&local_104b);
  std::allocator<unsigned_char>::~allocator(&local_1032);
  std::allocator<unsigned_char>::~allocator(&local_101d);
  std::allocator<unsigned_char>::~allocator(&local_1003);
  std::allocator<unsigned_char>::~allocator(&local_fec);
  std::allocator<unsigned_char>::~allocator(&local_fd2);
  std::allocator<unsigned_char>::~allocator(&local_fba);
  std::allocator<unsigned_char>::~allocator(&local_fa2);
  for (__end1_1 = (anon_struct_40_3_b217a906 *)local_f88;
      __end1_1 != (anon_struct_40_3_b217a906 *)&kInvalidTests[10].mask; __end1_1 = __end1_1 + 1) {
    paStack_10b8 = __end1_1;
    testing::ScopedTrace::ScopedTrace<int>
              (&local_10b9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x6bc,&__end1_1->format);
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)auStack_10e0,&paStack_10b8->in);
    Bytes::Bytes(&local_10d0,_auStack_10e0);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_10ba,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x6bd,&local_10d0);
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              ((ScopedTrace *)
               ((long)&gtest_ar_16.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x6be,&paStack_10b8->mask);
    local_1100[1] = 0xffffffff;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_10b8->in);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_10b8->in);
    local_1100[0] =
         ASN1_mbstring_copy((ASN1_STRING **)0x0,puVar4,(int)sVar5,paStack_10b8->format,
                            paStack_10b8->mask);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_10f8,"-1",
               "ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(), t.format, t.mask)",
               local_1100 + 1,local_1100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f8);
    if (!bVar1) {
      testing::Message::Message(&local_1108);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_10f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&str_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x6c1,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&str_1,&local_1108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&str_1);
      testing::Message::~Message(&local_1108);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f8);
    ERR_clear_error();
    gtest_ar_17.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    local_1130[1] = 0xffffffff;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_10b8->in);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_10b8->in);
    local_1130[0] =
         ASN1_mbstring_copy((ASN1_STRING **)&gtest_ar_17.message_,puVar4,(int)sVar5,
                            paStack_10b8->format,paStack_10b8->mask);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1128,"-1",
               "ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask)",local_1130 + 1
               ,local_1130);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
    if (!bVar1) {
      testing::Message::Message(&local_1138);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x6c6,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_1138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
      testing::Message::~Message(&local_1138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
    ERR_clear_error();
    testing::internal::EqHelper::Compare<asn1_string_st>
              ((EqHelper *)local_1150,"nullptr","str",(nullptr_t)0x0,
               (asn1_string_st *)
               gtest_ar_17.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1150);
    if (!bVar1) {
      testing::Message::Message(&local_1158);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1150);
      testing::internal::AssertHelper::AssertHelper
                (&local_1160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x6c8,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1160,&local_1158);
      testing::internal::AssertHelper::~AssertHelper(&local_1160);
      testing::Message::~Message(&local_1158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1150);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&gtest_ar_16.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    testing::ScopedTrace::~ScopedTrace(&local_10ba);
    testing::ScopedTrace::~ScopedTrace(&local_10b9);
  }
  local_17a0 = (__1 *)&kInvalidTests[10].mask;
  do {
    local_17a0 = local_17a0 + -0x28;
    TestBody()::$_1::~__1(local_17a0);
  } while (local_17a0 != (__1 *)local_f88);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
LAB_001f9e09:
  local_17b8 = (__0 *)&kTests[0x11].num_codepoints;
  do {
    local_17b8 = local_17b8 + -0x50;
    TestBody()::$_0::~__0(local_17b8);
  } while (local_17b8 != (__0 *)local_5b8);
  return;
}

Assistant:

TEST(ASN1Test, MBString) {
  const unsigned long kAll = B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING |
                             B_ASN1_T61STRING | B_ASN1_BMPSTRING |
                             B_ASN1_UNIVERSALSTRING | B_ASN1_UTF8STRING;

  const struct {
    int format;
    std::vector<uint8_t> in;
    unsigned long mask;
    int expected_type;
    std::vector<uint8_t> expected_data;
    int num_codepoints;
  } kTests[] = {
      // Given a choice of formats, we pick the smallest that fits.
      {MBSTRING_UTF8, {}, kAll, V_ASN1_PRINTABLESTRING, {}, 0},
      {MBSTRING_UTF8, {'a'}, kAll, V_ASN1_PRINTABLESTRING, {'a'}, 1},
      {MBSTRING_UTF8,
       {'a', 'A', '0', '\'', '(', ')', '+', ',', '-', '.', '/', ':', '=', '?'},
       kAll,
       V_ASN1_PRINTABLESTRING,
       {'a', 'A', '0', '\'', '(', ')', '+', ',', '-', '.', '/', ':', '=', '?'},
       14},
      {MBSTRING_UTF8, {'*'}, kAll, V_ASN1_IA5STRING, {'*'}, 1},
      {MBSTRING_UTF8, {'\n'}, kAll, V_ASN1_IA5STRING, {'\n'}, 1},
      {MBSTRING_UTF8,
       {0xc2, 0x80 /* U+0080 */},
       kAll,
       V_ASN1_T61STRING,
       {0x80},
       1},
      {MBSTRING_UTF8,
       {0xc4, 0x80 /* U+0100 */},
       kAll,
       V_ASN1_BMPSTRING,
       {0x01, 0x00},
       1},
      {MBSTRING_UTF8,
       {0xf0, 0x90, 0x80, 0x80 /* U+10000 */},
       kAll,
       V_ASN1_UNIVERSALSTRING,
       {0x00, 0x01, 0x00, 0x00},
       1},
      {MBSTRING_UTF8,
       {0xf0, 0x90, 0x80, 0x80 /* U+10000 */},
       kAll & ~B_ASN1_UNIVERSALSTRING,
       V_ASN1_UTF8STRING,
       {0xf0, 0x90, 0x80, 0x80},
       1},

      // NUL is not printable. It should also not terminate iteration.
      {MBSTRING_UTF8, {0}, kAll, V_ASN1_IA5STRING, {0}, 1},
      {MBSTRING_UTF8, {0, 'a'}, kAll, V_ASN1_IA5STRING, {0, 'a'}, 2},

      // When a particular format is specified, we use it.
      {MBSTRING_UTF8,
       {'a'},
       B_ASN1_PRINTABLESTRING,
       V_ASN1_PRINTABLESTRING,
       {'a'},
       1},
      {MBSTRING_UTF8, {'a'}, B_ASN1_IA5STRING, V_ASN1_IA5STRING, {'a'}, 1},
      {MBSTRING_UTF8, {'a'}, B_ASN1_T61STRING, V_ASN1_T61STRING, {'a'}, 1},
      {MBSTRING_UTF8, {'a'}, B_ASN1_UTF8STRING, V_ASN1_UTF8STRING, {'a'}, 1},
      {MBSTRING_UTF8,
       {'a'},
       B_ASN1_BMPSTRING,
       V_ASN1_BMPSTRING,
       {0x00, 'a'},
       1},
      {MBSTRING_UTF8,
       {'a'},
       B_ASN1_UNIVERSALSTRING,
       V_ASN1_UNIVERSALSTRING,
       {0x00, 0x00, 0x00, 'a'},
       1},

      // A long string with characters of many widths, to test sizes are
      // measured in code points.
      {MBSTRING_UTF8,
       {
           'a',                     //
           0xc2, 0x80,              // U+0080
           0xc4, 0x80,              // U+0100
           0xf0, 0x90, 0x80, 0x80,  // U+10000
       },
       B_ASN1_UNIVERSALSTRING,
       V_ASN1_UNIVERSALSTRING,
       {
           0x00, 0x00, 0x00, 'a',   //
           0x00, 0x00, 0x00, 0x80,  //
           0x00, 0x00, 0x01, 0x00,  //
           0x00, 0x01, 0x00, 0x00,  //
       },
       4},
  };
  for (const auto &t : kTests) {
    SCOPED_TRACE(t.format);
    SCOPED_TRACE(Bytes(t.in));
    SCOPED_TRACE(t.mask);

    // Passing in nullptr should do a dry run.
    EXPECT_EQ(t.expected_type,
              ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(), t.format,
                                 t.mask));

    // Test allocating a new object.
    ASN1_STRING *str = nullptr;
    EXPECT_EQ(
        t.expected_type,
        ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask));
    ASSERT_TRUE(str);
    EXPECT_EQ(t.expected_type, ASN1_STRING_type(str));
    EXPECT_EQ(Bytes(t.expected_data),
              Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str)));

    // Test writing into an existing object.
    ASN1_STRING_free(str);
    str = ASN1_STRING_new();
    ASSERT_TRUE(str);
    ASN1_STRING *old_str = str;
    EXPECT_EQ(
        t.expected_type,
        ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format, t.mask));
    ASSERT_EQ(old_str, str);
    EXPECT_EQ(t.expected_type, ASN1_STRING_type(str));
    EXPECT_EQ(Bytes(t.expected_data),
              Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str)));
    ASN1_STRING_free(str);
    str = nullptr;

    // minsize and maxsize should be enforced, even in a dry run.
    EXPECT_EQ(t.expected_type,
              ASN1_mbstring_ncopy(nullptr, t.in.data(), t.in.size(), t.format,
                                  t.mask, /*minsize=*/t.num_codepoints,
                                  /*maxsize=*/t.num_codepoints));

    EXPECT_EQ(t.expected_type,
              ASN1_mbstring_ncopy(&str, t.in.data(), t.in.size(), t.format,
                                  t.mask, /*minsize=*/t.num_codepoints,
                                  /*maxsize=*/t.num_codepoints));
    ASSERT_TRUE(str);
    EXPECT_EQ(t.expected_type, ASN1_STRING_type(str));
    EXPECT_EQ(Bytes(t.expected_data),
              Bytes(ASN1_STRING_get0_data(str), ASN1_STRING_length(str)));
    ASN1_STRING_free(str);
    str = nullptr;

    EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                      nullptr, t.in.data(), t.in.size(), t.format, t.mask,
                      /*minsize=*/t.num_codepoints + 1, /*maxsize=*/0));
    ERR_clear_error();
    EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                      &str, t.in.data(), t.in.size(), t.format, t.mask,
                      /*minsize=*/t.num_codepoints + 1, /*maxsize=*/0));
    EXPECT_FALSE(str);
    ERR_clear_error();
    if (t.num_codepoints > 1) {
      EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                        nullptr, t.in.data(), t.in.size(), t.format, t.mask,
                        /*minsize=*/0, /*maxsize=*/t.num_codepoints - 1));
      ERR_clear_error();
      EXPECT_EQ(-1, ASN1_mbstring_ncopy(
                        &str, t.in.data(), t.in.size(), t.format, t.mask,
                        /*minsize=*/0, /*maxsize=*/t.num_codepoints - 1));
      EXPECT_FALSE(str);
      ERR_clear_error();
    }
  }

  const struct {
    int format;
    std::vector<uint8_t> in;
    unsigned long mask;
  } kInvalidTests[] = {
      // Invalid encodings are rejected.
      {MBSTRING_UTF8, {0xff}, B_ASN1_UTF8STRING},
      {MBSTRING_BMP, {0xff}, B_ASN1_UTF8STRING},
      {MBSTRING_UNIV, {0xff}, B_ASN1_UTF8STRING},

      // Lone surrogates are not code points.
      {MBSTRING_UTF8, {0xed, 0xa0, 0x80}, B_ASN1_UTF8STRING},
      {MBSTRING_BMP, {0xd8, 0x00}, B_ASN1_UTF8STRING},
      {MBSTRING_UNIV, {0x00, 0x00, 0xd8, 0x00}, B_ASN1_UTF8STRING},

      // The input does not fit in the allowed output types.
      {MBSTRING_UTF8, {'\n'}, B_ASN1_PRINTABLESTRING},
      {MBSTRING_UTF8,
       {0xc2, 0x80 /* U+0080 */},
       B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING},
      {MBSTRING_UTF8,
       {0xc4, 0x80 /* U+0100 */},
       B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING | B_ASN1_T61STRING},
      {MBSTRING_UTF8,
       {0xf0, 0x90, 0x80, 0x80 /* U+10000 */},
       B_ASN1_PRINTABLESTRING | B_ASN1_IA5STRING | B_ASN1_T61STRING |
           B_ASN1_BMPSTRING},

      // Unrecognized bits are ignored.
      {MBSTRING_UTF8, {'\n'}, B_ASN1_PRINTABLESTRING | B_ASN1_SEQUENCE},
  };
  for (const auto &t : kInvalidTests) {
    SCOPED_TRACE(t.format);
    SCOPED_TRACE(Bytes(t.in));
    SCOPED_TRACE(t.mask);

    EXPECT_EQ(-1, ASN1_mbstring_copy(nullptr, t.in.data(), t.in.size(),
                                     t.format, t.mask));
    ERR_clear_error();

    ASN1_STRING *str = nullptr;
    EXPECT_EQ(-1, ASN1_mbstring_copy(&str, t.in.data(), t.in.size(), t.format,
                                     t.mask));
    ERR_clear_error();
    EXPECT_EQ(nullptr, str);
  }
}